

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void ghc::filesystem::create_hard_link(path *to,path *new_hard_link)

{
  int code;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  error_code local_58;
  string local_48;
  
  local_58._M_value = 0;
  local_58._M_cat = (error_category *)std::_V2::system_category();
  detail::create_hardlink(to,new_hard_link,&local_58);
  code = local_58._M_value;
  if (local_58._M_value == 0) {
    return;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_48,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_58._M_cat;
  filesystem_error::filesystem_error(this,&local_48,to,new_hard_link,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void create_hard_link(const path& to, const path& new_hard_link)
{
    std::error_code ec;
    create_hard_link(to, new_hard_link, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), to, new_hard_link, ec);
    }
}